

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class_metadata.hpp
# Opt level: O2

void boost::python::objects::
     register_shared_ptr_from_python_and_casts<SpikesConsumer,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>>
               (void)

{
  shared_ptr_from_python<SpikesConsumer,_std::shared_ptr> local_2;
  shared_ptr_from_python<SpikesConsumer,_boost::shared_ptr> local_1;
  
  converter::shared_ptr_from_python<SpikesConsumer,_boost::shared_ptr>::shared_ptr_from_python
            (&local_1);
  converter::shared_ptr_from_python<SpikesConsumer,_std::shared_ptr>::shared_ptr_from_python
            (&local_2);
  register_dynamic_id<SpikesConsumer>((SpikesConsumer *)0x0);
  mpl::
  for_each<boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,std::add_pointer<mpl_::arg<_1>>,boost::python::objects::register_base_of<SpikesConsumer>>
            (0,0);
  return;
}

Assistant:

inline void register_shared_ptr_from_python_and_casts(T*, Bases)
{
  // Constructor performs registration
  python::detail::force_instantiate(converter::shared_ptr_from_python<T, boost::shared_ptr>());
#if __cplusplus >= 201103L
  python::detail::force_instantiate(converter::shared_ptr_from_python<T, std::shared_ptr>());
#endif

  //
  // register all up/downcasts here.  We're using the alternate
  // interface to mpl::for_each to avoid an MSVC 6 bug.
  //
  register_dynamic_id<T>();
  mpl::for_each(register_base_of<T>(), (Bases*)0, (boost::python::detail::add_pointer<mpl::_>*)0);
}